

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

void __thiscall
QPDFFormFieldObjectHelper::generateAppearance
          (QPDFFormFieldObjectHelper *this,QPDFAnnotationObjectHelper *aoh)

{
  bool bVar1;
  string ft;
  string sStack_38;
  
  getFieldType_abi_cxx11_(&sStack_38,this);
  bVar1 = std::operator==(&sStack_38,"/Tx");
  if (!bVar1) {
    bVar1 = std::operator==(&sStack_38,"/Ch");
    if (!bVar1) goto LAB_0015a33e;
  }
  generateTextAppearance(this,aoh);
LAB_0015a33e:
  std::__cxx11::string::~string((string *)&sStack_38);
  return;
}

Assistant:

void
QPDFFormFieldObjectHelper::generateAppearance(QPDFAnnotationObjectHelper& aoh)
{
    std::string ft = getFieldType();
    // Ignore field types we don't know how to generate appearances for. Button fields don't really
    // need them -- see code in QPDFAcroFormDocumentHelper::generateAppearancesIfNeeded.
    if ((ft == "/Tx") || (ft == "/Ch")) {
        generateTextAppearance(aoh);
    }
}